

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_resource_manager.cpp
# Opt level: O2

TextureId __thiscall
CS248::GLResourceManager::createTextureFromData
          (GLResourceManager *this,uchar *data,int width,int height)

{
  TextureId TVar1;
  long *in_RAX;
  pointer *__ptr;
  uchar *puVar2;
  long *local_28;
  
  puVar2 = data;
  local_28 = in_RAX;
  TVar1 = createTexture(this);
  bindTexture((GLResourceManager *)&local_28,(TextureId)(GLuint)puVar2);
  glTexImage2D(0xde1,0,0x1907,width,height,0,0x1908,0x1401,data);
  glTexParameteri(0xde1,0x2802,0x2901);
  glTexParameteri(0xde1,0x2803,0x2901);
  glTexParameteri(0xde1,0x2801,0x2601);
  glTexParameteri(0xde1,0x2800,0x2601);
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))();
  }
  return (TextureId)TVar1.id;
}

Assistant:

TextureId GLResourceManager::createTextureFromData(const unsigned char* data, int width, int height) {
  TextureId texid = createTexture();
  auto tex_bind = bindTexture(texid);
  glTexImage2D(GL_TEXTURE_2D, /*level=*/0, GL_RGB, width, height, /*border=*/0, GL_RGBA, GL_UNSIGNED_BYTE, (void *)data);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);  
  //glGenerateMipmap(GL_TEXTURE_2D);
  return texid;
}